

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalCreateFile
                    (CPalThread *pThread,LPCSTR lpFileName,DWORD dwDesiredAccess,DWORD dwShareMode,
                    LPSECURITY_ATTRIBUTES lpSecurityAttributes,DWORD dwCreationDisposition,
                    DWORD dwFlagsAndAttributes,HANDLE hTemplateFile,HANDLE *phFile)

{
  bool bVar1;
  FILE *__stream;
  CPalThread *pCVar2;
  int iVar3;
  PAL_ERROR PVar4;
  PAL_ERROR PVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  errno_t eVar9;
  size_t sVar10;
  char *pcVar11;
  LPSTR pCVar12;
  int *piVar13;
  uint *puVar14;
  bool bVar15;
  undefined4 uStackY_140;
  undefined1 local_130 [8];
  stat st;
  CObjectAttributes oaFile;
  IPalObject *pRegisteredFile;
  undefined8 *local_78;
  CFileProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IFileLockController *pLockController;
  long *local_58;
  IPalObject *pFileObject;
  uint local_44;
  char *local_40;
  CPalThread *local_38;
  
  local_58 = (long *)0x0;
  oaFile.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  local_78 = (undefined8 *)0x0;
  pDataLock = (IDataLock *)0x0;
  st.__glibc_reserved[2] = 0;
  oaFile.sObjectName.m_pwsz = (WCHAR *)0x0;
  oaFile.sObjectName._8_8_ = lpSecurityAttributes;
  local_38 = pThread;
  if (7 < dwShareMode) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x1ec);
    fprintf(_stderr,"dwShareMode is invalid\n");
    PVar4 = 0x57;
LAB_0012199d:
    bVar1 = false;
    pCVar12 = (LPSTR)0x0;
    bVar15 = false;
    local_40 = (char *)0x0;
    goto LAB_001219aa;
  }
  if (lpFileName == (LPCSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_00121f65;
    PVar4 = 3;
    goto LAB_0012199d;
  }
  sVar10 = strlen(lpFileName);
  if (0x3ff < sVar10) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
    PVar4 = 0xce;
    goto LAB_0012199d;
  }
  pFileObject = (IPalObject *)(ulong)dwCreationDisposition;
  sVar10 = strlen("\\\\.\\");
  iVar3 = strncmp(lpFileName,"\\\\.\\",sVar10);
  if (iVar3 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
    PVar4 = 0x57;
    goto LAB_0012199d;
  }
  pcVar11 = InternalStrdup(lpFileName);
  if (pcVar11 == (char *)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
    PVar4 = 8;
    goto LAB_0012199d;
  }
  pCVar12 = (LPSTR)InternalMalloc(0x1001);
  if (pCVar12 == (LPSTR)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
    PVar4 = 8;
    pCVar12 = (LPSTR)0x0;
LAB_00121a4e:
    bVar1 = false;
    bVar15 = false;
    local_40 = pcVar11;
    goto LAB_001219aa;
  }
  pLockController = (IFileLockController *)(ulong)dwDesiredAccess;
  memset(pCVar12,0,0x1001);
  FILEDosToUnixPathA(pcVar11);
  local_40 = pCVar12;
  PVar4 = InternalCanonicalizeRealPath(pcVar11,pCVar12,0x1001);
  pCVar12 = local_40;
  if (PVar4 != 0) goto LAB_00121a4e;
  InternalFree(pcVar11);
  uVar6 = (int)pLockController << 2 | (int)pLockController + 0x80000000U >> 0x1e;
  if (3 < uVar6) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
    PVar4 = 0x57;
    goto LAB_00121bc1;
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
  uVar6 = *(uint *)(&DAT_001667f0 + (ulong)uVar6 * 4);
  if (lpSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    if (((lpSecurityAttributes->nLength == 0x18) &&
        (lpSecurityAttributes->lpSecurityDescriptor == (LPVOID)0x0)) &&
       (lpSecurityAttributes->bInheritHandle != 0)) {
      uStackY_140 = 1;
      goto LAB_00121b01;
    }
    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x246);
    pcVar11 = "lpSecurityAttributes points to invalid values.\n";
LAB_00121bb6:
    fprintf(_stderr,pcVar11);
LAB_00121bbd:
    PVar4 = 0x57;
LAB_00121bc1:
    bVar1 = false;
    pCVar12 = (LPSTR)0x0;
    bVar15 = false;
    goto LAB_001219aa;
  }
  uStackY_140 = 0;
LAB_00121b01:
  if ((dwFlagsAndAttributes & 0x45ffff7f) != 0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x250);
    pcVar11 = "Bad dwFlagsAndAttributes\n";
    goto LAB_00121bb6;
  }
  uVar7 = 0;
  if ((((dwFlagsAndAttributes >> 0x19 & 1) == 0) &&
      (iVar3 = stat64(local_40,(stat64 *)local_130), uVar7 = uVar6, iVar3 == 0)) &&
     ((st.st_nlink._1_1_ & 0x40) != 0)) {
    PVar4 = 5;
    goto LAB_00121bc1;
  }
  if (hTemplateFile != (HANDLE)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x26a);
    pcVar11 = "hTemplateFile is not NULL, as it should be.\n";
    goto LAB_00121bb6;
  }
  local_44 = uVar7;
  PVar4 = (*(code *)**(undefined8 **)g_pFileLockManager)
                    (g_pFileLockManager,local_38,local_40,pLockController,dwShareMode,&pDataLock);
  if (PVar4 != 0) goto LAB_00121bc1;
  uVar6 = (int)pFileObject - 1;
  switch(uVar6) {
  case 0:
    local_44 = local_44 | 0xc0;
    break;
  case 1:
    iVar3 = access(local_40,0);
    bVar15 = iVar3 == 0;
    local_44 = local_44 | 0x240;
    goto LAB_00121c7b;
  case 2:
    break;
  case 3:
    iVar3 = access(local_40,0);
    bVar15 = iVar3 == 0;
    local_44 = local_44 | 0x40;
    goto LAB_00121c7b;
  case 4:
    local_44 = local_44 | 0x200;
    break;
  default:
    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x2a6);
    fprintf(_stderr,"dwCreationDisposition value of %d is not valid\n",pFileObject);
    goto LAB_00121bbd;
  }
  bVar15 = false;
LAB_00121c7b:
  if ((dwFlagsAndAttributes >> 0x1d & 1) == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
    local_44 = local_44 | 0x4000;
  }
  iVar3 = InternalOpen(local_40,local_44,0x1a4);
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
  if (iVar3 < 0) {
    piVar13 = __errno_location();
    strerror(*piVar13);
    PVar4 = FILEGetLastErrorFromErrnoAndFilename(local_40);
    pFileObject = (IPalObject *)((ulong)pFileObject & 0xffffffff00000000);
LAB_00121e07:
    if (PVar4 == 0) {
      pCVar12 = (LPSTR)0x0;
      bVar1 = true;
      PVar4 = 0;
      goto LAB_001219aa;
    }
    if (-1 < iVar3) goto LAB_00121e7d;
  }
  else {
    pFileObject = (IPalObject *)
                  CONCAT44(pFileObject._4_4_,
                           (uint)((bVar15 ^ 1U) & ((int)pFileObject == 4 || uVar6 < 2)));
    iVar8 = flock(iVar3,(dwShareMode == 0) + '\x05');
    if (iVar8 == 0) {
      iVar8 = fcntl64(iVar3,2,1);
      if (iVar8 == -1) {
        fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x2f6);
        __stream = _stderr;
        puVar14 = (uint *)__errno_location();
        uVar6 = *puVar14;
        pcVar11 = strerror(uVar6);
        fprintf(__stream,"can\'t set close-on-exec flag; fcntl() failed. errno is %d (%s)\n",
                (ulong)uVar6,pcVar11);
        PVar4 = 0x54f;
      }
      else {
        PVar4 = (**(code **)*g_pObjectManager)
                          (g_pObjectManager,local_38,&otFile,st.__glibc_reserved + 2,&local_58);
        if ((PVar4 == 0) &&
           (PVar4 = (**(code **)(*local_58 + 0x18))(local_58,local_38,1,&pLocalData,&local_78),
           PVar4 == 0)) {
          eVar9 = strcpy_s((char *)(local_78 + 3),0x1000,local_40);
          pCVar2 = local_38;
          if (eVar9 == 0) {
            *(undefined4 *)(local_78 + 0x203) = uStackY_140;
            *(int *)(local_78 + 1) = iVar3;
            *(int *)((long)local_78 + 0xc) = (int)pLockController;
            *(uint *)(local_78 + 2) = local_44;
            *(uint *)((long)local_78 + 0x14) = (uint)((int)pLockController == 0);
            *local_78 = pDataLock;
            pDataLock = (IDataLock *)0x0;
            (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,local_38,1)
            ;
            pLocalData = (CFileProcessLocalData *)0x0;
            PVar4 = (**(code **)(*g_pObjectManager + 8))
                              (g_pObjectManager,pCVar2,local_58,aotFile,pLockController,phFile,
                               &oaFile.pSecurityAttributes);
            local_58 = (long *)0x0;
            goto LAB_00121e07;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
          PVar4 = 0x7a;
        }
      }
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00121f65;
      piVar13 = __errno_location();
      strerror(*piVar13);
      if (*piVar13 != 0xb) {
        PVar4 = FILEGetLastErrorFromErrno();
        goto LAB_00121e07;
      }
      PVar4 = 0x20;
    }
LAB_00121e7d:
    close(iVar3);
  }
  if (((char)pFileObject != '\0') && (iVar3 = unlink(local_40), iVar3 == -1)) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00121f65:
      abort();
    }
    piVar13 = __errno_location();
    strerror(*piVar13);
  }
  bVar1 = false;
  pCVar12 = (LPSTR)0x0;
LAB_001219aa:
  pCVar2 = local_38;
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[3])();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pCVar2,1);
  }
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 0x40))(local_58,pCVar2);
  }
  if (oaFile.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)oaFile.pSecurityAttributes + 0x40))(oaFile.pSecurityAttributes,pCVar2);
  }
  if (local_40 != (char *)0x0) {
    InternalFree(local_40);
  }
  if (pCVar12 != (LPSTR)0x0) {
    InternalFree(pCVar12);
  }
  PVar5 = 0xb7;
  if (!bVar15) {
    PVar5 = PVar4;
  }
  if (!bVar1) {
    PVar5 = PVar4;
  }
  return PVar5;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateFile(
    CPalThread *pThread,
    LPCSTR lpFileName,
    DWORD dwDesiredAccess,
    DWORD dwShareMode,
    LPSECURITY_ATTRIBUTES lpSecurityAttributes,
    DWORD dwCreationDisposition,
    DWORD dwFlagsAndAttributes,
    HANDLE hTemplateFile,
    HANDLE *phFile
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    IPalObject *pRegisteredFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IFileLockController *pLockController = NULL;
    CObjectAttributes oaFile(NULL, lpSecurityAttributes);
    BOOL fFileExists = FALSE;

    BOOL inheritable = FALSE;
    LPSTR lpUnixPath = NULL;
    int   filed = -1;
    int   create_flags = (S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    int   open_flags = 0;
    int   lock_mode = LOCK_SH;

    // track whether we've created the file with the intended name,
    // so that it can be removed on failure exit
    BOOL bFileCreated = FALSE;

    const char* szNonfilePrefix = "\\\\.\\";
    LPSTR lpFullUnixPath = NULL;
    DWORD cchFullUnixPath = PATH_MAX+1; // InternalCanonicalizeRealPath requires this to be at least PATH_MAX

    /* for dwShareMode only three flags are accepted */
    if ( dwShareMode & ~(FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE) )
    {
        ASSERT( "dwShareMode is invalid\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if ( lpFileName == NULL )
    {
        ERROR("InternalCreateFile called with NULL filename\n");
        palError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    if ( strlen(lpFileName) >= MAX_LONGPATH )
    {
        WARN("InternalCreateFile called with a filename whose size is "
                "%d >= MAX_LONGPATH (%d)\n", strlen(lpFileName), MAX_LONGPATH);
        palError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    if ( strncmp(lpFileName, szNonfilePrefix, strlen(szNonfilePrefix)) == 0 )
    {
        ERROR("InternalCreateFile does not support paths beginning with %s\n", szNonfilePrefix);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    lpUnixPath = InternalStrdup(lpFileName);
    if ( lpUnixPath == NULL )
    {
        ERROR("InternalStrdup() failed\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    lpFullUnixPath =  reinterpret_cast<LPSTR>(InternalMalloc(cchFullUnixPath));
    if ( lpFullUnixPath == NULL )
    {
        ERROR("InternalMalloc() failed\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    // Initialize the path to zeroes...
    ZeroMemory(lpFullUnixPath, cchFullUnixPath);
    
    FILEDosToUnixPathA( lpUnixPath );

    // Compute the absolute pathname to the file.  This pathname is used
    // to determine if two file names represent the same file.
    palError = InternalCanonicalizeRealPath(lpUnixPath, lpFullUnixPath, cchFullUnixPath);
    if (palError != NO_ERROR)
    {
        goto done;
    }

    InternalFree(lpUnixPath);
    lpUnixPath = lpFullUnixPath;
    lpFullUnixPath = NULL;

    switch( dwDesiredAccess )
    {
    case 0:
        /* Device Query Access was requested. let's use open() with 
           no flags, it's basically the equivalent of O_RDONLY, since 
           O_RDONLY is defined as 0x0000 */
        break;
    case( GENERIC_READ ):
        open_flags |= O_RDONLY;
        break;
    case( GENERIC_WRITE ):
        open_flags |= O_WRONLY;
        break;
    case( GENERIC_READ | GENERIC_WRITE ):
        open_flags |= O_RDWR;
        break;
    default:
        ERROR("dwDesiredAccess value of %d is invalid\n", dwDesiredAccess);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    TRACE("open flags are 0x%lx\n", open_flags);
    
    if ( lpSecurityAttributes )
    {
        if ( lpSecurityAttributes->nLength != sizeof( SECURITY_ATTRIBUTES ) ||
             lpSecurityAttributes->lpSecurityDescriptor != NULL ||
             !lpSecurityAttributes->bInheritHandle )
        {
            ASSERT("lpSecurityAttributes points to invalid values.\n");
            palError = ERROR_INVALID_PARAMETER;
            goto done;
        }
        inheritable = TRUE;
    }

    if ( (dwFlagsAndAttributes & PAL_LEGAL_FLAGS_ATTRIBS) !=
          dwFlagsAndAttributes)
    {
        ASSERT("Bad dwFlagsAndAttributes\n");
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    } 
    else if (dwFlagsAndAttributes & FILE_FLAG_BACKUP_SEMANTICS)
    {
        /* Override the open flags, and always open as readonly.  This
           flag is used when opening a directory, to change its
           creation/modification/access times.  On Windows, the directory
           must be open for write, but on Unix, it needs to be readonly. */
        open_flags = O_RDONLY;
    } else {
        struct stat st;

        if (stat(lpUnixPath, &st) == 0 && (st.st_mode & S_IFDIR))
        {
            /* The file exists and it is a directory.  Without
                   FILE_FLAG_BACKUP_SEMANTICS, Win32 CreateFile always fails
                   to open directories. */
                palError = ERROR_ACCESS_DENIED;
                goto done;
        }
    }

    if ( hTemplateFile )
    {
        ASSERT("hTemplateFile is not NULL, as it should be.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //
    // The file sharing mode checks are performed by the lock manager so we need
    // to get the lock controller for this file.
    // Do this before modifying the file system since we wouldn't want to, for
    // instance, truncate a file before finding out if we have write access to it.
    // It may seem odd that in some cases we will acquire a lock on a file that
    // doesn't exist yet but the lock manager does not care -- files are
    // abstract entities represented by a name from its point of view.
    //

    palError = g_pFileLockManager->GetLockControllerForFile(
        pThread, 
        lpUnixPath,
        dwDesiredAccess,
        dwShareMode,
        &pLockController
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    /* NB: According to MSDN docs, When CREATE_ALWAYS or OPEN_ALWAYS is
       set, CreateFile should SetLastError to ERROR_ALREADY_EXISTS,
       even though/if CreateFile will be successful.
    */
    switch( dwCreationDisposition )
    {
    case( CREATE_ALWAYS ):        
        // check whether the file exists
        if ( access( lpUnixPath, F_OK ) == 0 )
        {
            fFileExists = TRUE;
        }
        open_flags |= O_CREAT | O_TRUNC;
        break;
    case( CREATE_NEW ):
        open_flags |= O_CREAT | O_EXCL;
        break;
    case( OPEN_EXISTING ):
        /* don't need to do anything here */
        break;
    case( OPEN_ALWAYS ):
        if ( access( lpUnixPath, F_OK ) == 0 )
        {
            fFileExists = TRUE;
        }
        open_flags |= O_CREAT;
        break;
    case( TRUNCATE_EXISTING ):
        open_flags |= O_TRUNC;
        break;
    default:
        ASSERT("dwCreationDisposition value of %d is not valid\n",
              dwCreationDisposition);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if ( dwFlagsAndAttributes & FILE_FLAG_NO_BUFFERING )
    {
        TRACE("I/O will be unbuffered\n");
#ifdef O_DIRECT
        open_flags |= O_DIRECT;
#endif
    }
    else
    {
        TRACE("I/O will be buffered\n");
    }

    filed = InternalOpen(lpUnixPath, open_flags, create_flags);
    TRACE("Allocated file descriptor [%d]\n", filed);

    if ( filed < 0 )
    {
        TRACE("open() failed; error is %s (%d)\n", strerror(errno), errno);
        palError = FILEGetLastErrorFromErrnoAndFilename(lpUnixPath);
        goto done;
    }

    // Deduce whether we created a file in the previous operation (there's a
    // small timing window between the access() used to determine fFileExists
    // and the open() operation, but there's not much we can do about that.
    bFileCreated = (dwCreationDisposition == CREATE_ALWAYS ||
                    dwCreationDisposition == CREATE_NEW ||
                    dwCreationDisposition == OPEN_ALWAYS) &&
        !fFileExists;


    // While the lock manager is able to provide support for share modes within an instance of
    // the PAL, other PALs will ignore these locks.  In order to support a basic level of cross
    // process locking, we'll use advisory locks.  FILE_SHARE_NONE implies a exclusive lock on the
    // file and all other modes use a shared lock.  While this is not as granular as Windows,
    // you can at least implement a lock file using this.
    lock_mode = (dwShareMode == 0 /* FILE_SHARE_NONE */) ? LOCK_EX : LOCK_SH;

    if(flock(filed, lock_mode | LOCK_NB) != 0) 
    {
        TRACE("flock() failed; error is %s (%d)\n", strerror(errno), errno);
        if (errno == EWOULDBLOCK) 
        {
            palError = ERROR_SHARING_VIOLATION;
        }
        else
        {
            palError = FILEGetLastErrorFromErrno();
        }

        goto done;
    }

#ifndef O_DIRECT
    if ( dwFlagsAndAttributes & FILE_FLAG_NO_BUFFERING )
    {
#ifdef F_NOCACHE
        if (-1 == fcntl(filed, F_NOCACHE, 1))
        {
            ASSERT("Can't set F_NOCACHE; fcntl() failed. errno is %d (%s)\n",
               errno, strerror(errno));
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }
#else
#error Insufficient support for uncached I/O on this platform
#endif
    }
#endif
    
    /* make file descriptor close-on-exec; inheritable handles will get
      "uncloseonexeced" in CreateProcess if they are actually being inherited*/
    if(-1 == fcntl(filed,F_SETFD,1))
    {
        ASSERT("can't set close-on-exec flag; fcntl() failed. errno is %d "
             "(%s)\n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oaFile,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (strcpy_s(pLocalData->unix_filename, sizeof(pLocalData->unix_filename), lpUnixPath) != SAFECRT_SUCCESS)
    {
        palError = ERROR_INSUFFICIENT_BUFFER;
        TRACE("strcpy_s failed!\n");
        goto done;
    }

    pLocalData->inheritable = inheritable;
    pLocalData->unix_fd = filed;
    pLocalData->dwDesiredAccess = dwDesiredAccess;
    pLocalData->open_flags = open_flags;
    pLocalData->open_flags_deviceaccessonly = (dwDesiredAccess == 0);

    //
    // Transfer the lock controller reference from our local variable
    // to the local file data
    //

    pLocalData->pLockController = pLockController;
    pLockController = NULL;

    //
    // We've finished initializing our local data, so release that lock
    //

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pFileObject,
        &aotFile, 
        dwDesiredAccess,
        phFile,
        &pRegisteredFile
        );

    //
    // pFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pFileObject = NULL;

done:

    // At this point, if we've been successful, palError will be NO_ERROR.
    // CreateFile can return ERROR_ALREADY_EXISTS in some success cases;
    // those cases are flagged by fFileExists and are handled below.
    if (NO_ERROR != palError)
    {
        if (filed >= 0)
        {
            close(filed);
        }
        if (bFileCreated)
        {
            if (-1 == unlink(lpUnixPath))
            {
                WARN("can't delete file; unlink() failed with errno %d (%s)\n",
                     errno, strerror(errno));
            }
        }
    }

    if (NULL != pLockController)
    {
        pLockController->ReleaseController();
    }

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, TRUE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (NULL != pRegisteredFile)
    {
        pRegisteredFile->ReleaseReference(pThread);
    }
    
    if (NULL != lpUnixPath)
    {
        InternalFree(lpUnixPath);
    }

    if (NULL != lpFullUnixPath)
    {
        InternalFree(lpFullUnixPath);
    }

    if (NO_ERROR == palError && fFileExists)
    {
        palError = ERROR_ALREADY_EXISTS;
    }

    return palError;
}